

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O0

Media * GetMediaAndPlatforms
                  (Media *__return_storage_ptr__,string *file_name,IntType *potential_platforms)

{
  bool bVar1;
  FixedType local_dc;
  anon_class_8_1_18cdd2e6 local_d8;
  undefined1 local_d0 [8];
  DiskOrMassStorageDevice media;
  undefined1 local_b0 [8];
  MediaAccumulator accumulator;
  IntType *potential_platforms_local;
  string *file_name_local;
  
  accumulator.extension_.field_2._8_8_ = potential_platforms;
  anon_unknown.dwarf_387fdd::MediaAccumulator::MediaAccumulator
            ((MediaAccumulator *)local_b0,file_name,potential_platforms);
  bVar1 = anon_unknown.dwarf_387fdd::MediaAccumulator::name_matches
                    ((MediaAccumulator *)local_b0,"2mg");
  if (bVar1) {
    Storage::Disk::Disk2MG::open(local_d0,(int)file_name);
    local_d8.accumulator = (MediaAccumulator *)local_b0;
    std::
    visit<GetMediaAndPlatforms(std::__cxx11::string_const&,int&)::__0,std::variant<decltype(nullptr),Storage::Disk::DiskImageHolderBase*,Storage::MassStorage::MassStorageDevice*>const&>
              (&local_d8,
               (variant<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                *)local_d0);
  }
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            ((MediaAccumulator *)local_b0,0x180000,"80");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            ((MediaAccumulator *)local_b0,0x180000,"81");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_b0,8,"a26");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AcornADF>>
            ((MediaAccumulator *)local_b0,0x760,"adf");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AmigaADF>>
            ((MediaAccumulator *)local_b0,0x80,"adf");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AcornADF>>
            ((MediaAccumulator *)local_b0,0x760,"adl");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_b0,0x20848,"bin");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::CAS>
            ((MediaAccumulator *)local_b0,0x20000,"cas");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::TZX>
            ((MediaAccumulator *)local_b0,1,"cdt");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_b0,0x800,"col");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::CSW>
            ((MediaAccumulator *)local_b0,0x3e1761,"csw");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::D64>>
            ((MediaAccumulator *)local_b0,0x1000,"d64");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::MassStorage::DAT>
            ((MediaAccumulator *)local_b0,0x760,"dat");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::DMK>>
            ((MediaAccumulator *)local_b0,0x20000,"dmk");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AppleDSK>>
            ((MediaAccumulator *)local_b0,0x2000,"do");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>>
            ((MediaAccumulator *)local_b0,0x760,"dsd");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::CPCDSK>>
            ((MediaAccumulator *)local_b0,0x240001,"dsk");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AppleDSK>>
            ((MediaAccumulator *)local_b0,0x2000,"dsk");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
            ((MediaAccumulator *)local_b0,0x10000,"dsk");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::MassStorage::HFV>
            ((MediaAccumulator *)local_b0,0x10000,"dsk");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::MassStorage::DSK>
            ((MediaAccumulator *)local_b0,0x10000,"dsk");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>>
            ((MediaAccumulator *)local_b0,0x20000,"dsk");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::OricMFMDSK>>
            ((MediaAccumulator *)local_b0,0x40000,"dsk");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::G64>>
            ((MediaAccumulator *)local_b0,0x1000,"g64");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::MassStorage::HDV>
            ((MediaAccumulator *)local_b0,2,"hdv");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::HFE>>
            ((MediaAccumulator *)local_b0,0x241761,"hfe");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>>
            ((MediaAccumulator *)local_b0,0x400000,"ima");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
            ((MediaAccumulator *)local_b0,0x10000,"image");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::IMD>>
            ((MediaAccumulator *)local_b0,0x400000,"imd");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
            ((MediaAccumulator *)local_b0,0x10000,"img");
  bVar1 = anon_unknown.dwarf_387fdd::MediaAccumulator::name_matches
                    ((MediaAccumulator *)local_b0,"img");
  if (bVar1) {
    (anonymous_namespace)::MediaAccumulator::
    insert<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>,std::__cxx11::string_const&>
              ((MediaAccumulator *)local_b0,0x800000,file_name);
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::IPF>>
            ((MediaAccumulator *)local_b0,0x200091,"ipf");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::MSA>>
            ((MediaAccumulator *)local_b0,0x10,"msa");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_b0,0x20000,"mx2");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::NIB>>
            ((MediaAccumulator *)local_b0,0x2000,"nib");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            ((MediaAccumulator *)local_b0,0x180000,"o");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            ((MediaAccumulator *)local_b0,0x180000,"p");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AppleDSK>>
            ((MediaAccumulator *)local_b0,0x2000,"po");
  bVar1 = anon_unknown.dwarf_387fdd::MediaAccumulator::name_matches
                    ((MediaAccumulator *)local_b0,"po");
  if (bVar1) {
    local_dc = GCR;
    (anonymous_namespace)::MediaAccumulator::
    try_insert<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>,std::__cxx11::string_const&,Storage::Disk::MacintoshIMG::FixedType>
              ((MediaAccumulator *)local_b0,4,file_name,&local_dc);
  }
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            ((MediaAccumulator *)local_b0,0x180000,"p81");
  bVar1 = anon_unknown.dwarf_387fdd::MediaAccumulator::name_matches
                    ((MediaAccumulator *)local_b0,"prg");
  if (bVar1) {
    (anonymous_namespace)::MediaAccumulator::
    insert<Storage::Cartridge::PRG,std::__cxx11::string_const&>
              ((MediaAccumulator *)local_b0,0x1000,file_name);
  }
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_b0,0x20840,"rom");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_b0,0x8000,"sg");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_b0,0x8000,"sms");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>>
            ((MediaAccumulator *)local_b0,0x760,"ssd");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>>
            ((MediaAccumulator *)local_b0,0x10,"st");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::STX>>
            ((MediaAccumulator *)local_b0,0x10,"stx");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::CommodoreTAP>
            ((MediaAccumulator *)local_b0,0x1000,"tap");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::OricTAP>
            ((MediaAccumulator *)local_b0,0x40000,"tap");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::ZXSpectrumTAP>
            ((MediaAccumulator *)local_b0,0x200000,"tap");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::TZX>
            ((MediaAccumulator *)local_b0,0x20000,"tsx");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::TZX>
            ((MediaAccumulator *)local_b0,0x380000,"tzx");
  anon_unknown.dwarf_387fdd::MediaAccumulator::try_standard<Storage::Tape::UEF>
            ((MediaAccumulator *)local_b0,0x760,"uef");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>>
            ((MediaAccumulator *)local_b0,0x2000,"woz");
  Analyser::Static::Media::Media(__return_storage_ptr__,(Media *)local_b0);
  anon_unknown.dwarf_387fdd::MediaAccumulator::~MediaAccumulator((MediaAccumulator *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

static Media GetMediaAndPlatforms(const std::string &file_name, TargetPlatform::IntType &potential_platforms) {
	MediaAccumulator accumulator(file_name, potential_platforms);

	// 2MG
	if(accumulator.name_matches("2mg")) {
		// 2MG uses a factory method; defer to it.
		try {
			const auto media = Disk::Disk2MG::open(file_name);
			std::visit([&](auto &&arg) {
				using Type = typename std::decay<decltype(arg)>::type;

				if constexpr (std::is_same<Type, std::nullptr_t>::value) {
					// It's valid for no media to be returned.
				} else if constexpr (std::is_same<Type, Disk::DiskImageHolderBase *>::value) {
					accumulator.insert(TargetPlatform::DiskII, std::shared_ptr<Disk::DiskImageHolderBase>(arg));
				} else if constexpr (std::is_same<Type, MassStorage::MassStorageDevice *>::value) {
					// TODO: or is it Apple IIgs?
					accumulator.insert(TargetPlatform::AppleII, std::shared_ptr<MassStorage::MassStorageDevice>(arg));
				} else {
					static_assert(always_false_v<Type>, "Unexpected type encountered.");
				}
			}, media);
		} catch(...) {}
	}

	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "80");
	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "81");

	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Atari2600, "a26");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AcornADF>>(TargetPlatform::Acorn, "adf");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AmigaADF>>(TargetPlatform::Amiga, "adf");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AcornADF>>(TargetPlatform::Acorn, "adl");

	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::AllCartridge, "bin");

	accumulator.try_standard<Tape::CAS>(TargetPlatform::MSX, "cas");
	accumulator.try_standard<Tape::TZX>(TargetPlatform::AmstradCPC, "cdt");
	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Coleco, "col");
	accumulator.try_standard<Tape::CSW>(TargetPlatform::AllTape, "csw");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::D64>>(TargetPlatform::Commodore, "d64");
	accumulator.try_standard<MassStorage::DAT>(TargetPlatform::Acorn, "dat");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::DMK>>(TargetPlatform::MSX, "dmk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AppleDSK>>(TargetPlatform::DiskII, "do");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::SSD>>(TargetPlatform::Acorn, "dsd");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::CPCDSK>>(
		TargetPlatform::AmstradCPC | TargetPlatform::Oric | TargetPlatform::ZXSpectrum, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AppleDSK>>(TargetPlatform::DiskII, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::MacintoshIMG>>(TargetPlatform::Macintosh, "dsk");
	accumulator.try_standard<MassStorage::HFV>(TargetPlatform::Macintosh, "dsk");
	accumulator.try_standard<MassStorage::DSK>(TargetPlatform::Macintosh, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::MSX, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::OricMFMDSK>>(TargetPlatform::Oric, "dsk");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::G64>>(TargetPlatform::Commodore, "g64");

	accumulator.try_standard<MassStorage::HDV>(TargetPlatform::AppleII, "hdv");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::HFE>>(
		TargetPlatform::Acorn | TargetPlatform::AmstradCPC | TargetPlatform::Commodore | TargetPlatform::Oric | TargetPlatform::ZXSpectrum,
		"hfe");	// TODO: switch to AllDisk once the MSX stops being so greedy.

	accumulator.try_standard<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::PCCompatible, "ima");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::MacintoshIMG>>(TargetPlatform::Macintosh, "image");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::IMD>>(TargetPlatform::PCCompatible, "imd");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::MacintoshIMG>>(TargetPlatform::Macintosh, "img");

	// Treat PC booter as a potential backup only if this doesn't parse as a FAT12.
	if(accumulator.name_matches("img")) {
		try {
			accumulator.insert<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::FAT12, file_name);
		} catch(...) {
			accumulator.try_standard<Disk::DiskImageHolder<Disk::PCBooter>>(TargetPlatform::PCCompatible, "img");
		}
	}

	accumulator.try_standard<Disk::DiskImageHolder<Disk::IPF>>(
		TargetPlatform::Amiga | TargetPlatform::AtariST | TargetPlatform::AmstradCPC | TargetPlatform::ZXSpectrum,
		"ipf");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::MSA>>(TargetPlatform::AtariST, "msa");
	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::MSX, "mx2");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::NIB>>(TargetPlatform::DiskII, "nib");

	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "o");
	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "p");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AppleDSK>>(TargetPlatform::DiskII, "po");

	if(accumulator.name_matches("po"))	{
		accumulator.try_insert<Disk::DiskImageHolder<Disk::MacintoshIMG>>(
			TargetPlatform::AppleIIgs,
			file_name, Disk::MacintoshIMG::FixedType::GCR);
	}

	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "p81");

	if(accumulator.name_matches("prg")) {
		// Try instantiating as a ROM; failing that accept as a tape.
		try {
			accumulator.insert<Cartridge::PRG>(TargetPlatform::Commodore, file_name);
		} catch(...) {
			try {
				accumulator.insert<Tape::PRG>(TargetPlatform::Commodore, file_name);
			} catch(...) {}
		}
	}

	accumulator.try_standard<Cartridge::BinaryDump>(
		TargetPlatform::AcornElectron | TargetPlatform::Coleco | TargetPlatform::MSX,
		"rom");

	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Sega, "sg");
	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Sega, "sms");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::SSD>>(TargetPlatform::Acorn, "ssd");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::AtariST, "st");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::STX>>(TargetPlatform::AtariST, "stx");

	accumulator.try_standard<Tape::CommodoreTAP>(TargetPlatform::Commodore, "tap");
	accumulator.try_standard<Tape::OricTAP>(TargetPlatform::Oric, "tap");
	accumulator.try_standard<Tape::ZXSpectrumTAP>(TargetPlatform::ZXSpectrum, "tap");
	accumulator.try_standard<Tape::TZX>(TargetPlatform::MSX, "tsx");
	accumulator.try_standard<Tape::TZX>(TargetPlatform::ZX8081 | TargetPlatform::ZXSpectrum, "tzx");

	accumulator.try_standard<Tape::UEF>(TargetPlatform::Acorn, "uef");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::WOZ>>(TargetPlatform::DiskII, "woz");

	return accumulator.media;
}